

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDALine.h
# Opt level: O0

void __thiscall
TRM::line_bresenham_interpolator::line_bresenham_interpolator
          (line_bresenham_interpolator *this,int x1,int y1,int x2,int y2)

{
  int iVar1;
  int iVar2;
  int local_5c;
  int local_54;
  int local_44;
  uint local_34;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  line_bresenham_interpolator *this_local;
  
  iVar1 = line_lr(x1);
  this->m_x1_lr = iVar1;
  iVar1 = line_lr(y1);
  this->m_y1_lr = iVar1;
  iVar1 = line_lr(x2);
  this->m_x2_lr = iVar1;
  iVar1 = line_lr(y2);
  this->m_y2_lr = iVar1;
  iVar1 = this->m_x2_lr - this->m_x1_lr;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  iVar2 = this->m_y2_lr - this->m_y1_lr;
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  this->m_ver = iVar1 < iVar2;
  if ((this->m_ver & 1U) == 0) {
    local_34 = this->m_x2_lr - this->m_x1_lr;
    if ((int)local_34 < 1) {
      local_34 = -local_34;
    }
  }
  else {
    local_34 = this->m_y2_lr - this->m_y1_lr;
    if ((int)local_34 < 1) {
      local_34 = -local_34;
    }
  }
  this->m_len = local_34;
  if ((this->m_ver & 1U) == 0) {
    local_44 = -1;
    if (x1 < x2) {
      local_44 = 1;
    }
  }
  else {
    local_44 = -1;
    if (y1 < y2) {
      local_44 = 1;
    }
  }
  this->m_inc = local_44;
  local_54 = y1;
  if ((this->m_ver & 1U) != 0) {
    local_54 = x1;
  }
  local_5c = y2;
  if ((this->m_ver & 1U) != 0) {
    local_5c = x2;
  }
  dda2_line_interpolator::dda2_line_interpolator
            (&this->m_interpolator,local_54,local_5c,this->m_len);
  return;
}

Assistant:

explicit line_bresenham_interpolator(int x1, int y1, int x2, int y2)
      : m_x1_lr(line_lr(x1)),
        m_y1_lr(line_lr(y1)),
        m_x2_lr(line_lr(x2)),
        m_y2_lr(line_lr(y2)),
        m_ver(std::abs(m_x2_lr - m_x1_lr) < std::abs(m_y2_lr - m_y1_lr)),
        m_len(m_ver ? std::abs(m_y2_lr - m_y1_lr)
                    : std::abs(m_x2_lr - m_x1_lr)),
        m_inc(m_ver ? ((y2 > y1) ? 1 : -1) : ((x2 > x1) ? 1 : -1)),
        m_interpolator(m_ver ? x1 : y1, m_ver ? x2 : y2, m_len) {}